

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<-1>_>
::DoMarkForResultVars
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>
           *this)

{
  bool bVar1;
  ExpressionAcceptanceLevel EVar2;
  size_type sVar3;
  reference con_00;
  NLBaseReif<_1> *pNVar4;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>
  *in_RDI;
  NLBaseReif<_1> *con;
  value_type *cnt;
  int i;
  ExpressionAcceptanceLevel eal;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  BasicConstraintKeeper *in_stack_ffffffffffffffe0;
  int iVar5;
  int iVar6;
  
  EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(in_stack_ffffffffffffffe0);
  if (EVar2 != NotAccepted) {
    iVar5 = 0;
    while (iVar6 = iVar5,
          sVar3 = std::
                  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<-1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<-1>_>::Container>_>
                  ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>::Container>_>
                          *)0x3c1649), iVar5 < (int)sVar3) {
      con_00 = std::
               deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<-1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<-1>_>::Container>_>
               ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<_1>_>::Container>_>
                             *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      bVar1 = Container::IsRedundant((Container *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
      if (!bVar1) {
        pNVar4 = Container::GetCon((Container *)0x3c1687);
        GetConverter(in_RDI);
        Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
        ::ConsiderMarkingResultVar<mp::NLBaseReif<_1>>
                  ((Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)CONCAT44(EVar2,iVar6),(NLBaseReif<_1> *)con_00,(int)((ulong)pNVar4 >> 0x20),
                   (ExpressionAcceptanceLevel)pNVar4);
      }
      iVar5 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

void DoMarkForResultVars() {
    const auto eal        // as expr only
        = GetChosenAcceptanceLevelEXPR();
    if (ExpressionAcceptanceLevel::NotAccepted!=eal) {    // accepted
      for (int i=0; i< (int)cons_.size(); ++i) {
        const auto& cnt = cons_[i];
        if (!cnt.IsRedundant()) {
          const auto& con = cnt.GetCon();
          // Delegate actual logic to Converter
          GetConverter().ConsiderMarkingResultVar(con, i, eal);
        }
      }
    }
  }